

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  PromiseNode *pPVar3;
  WebSocket *pWVar4;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *pWVar5;
  void *in_R8;
  Own<kj::WebSocket> OVar6;
  Own<kj::HttpHeaders> headersCopy;
  Own<kj::_::PromiseNode> local_d8;
  Own<kj::_::PromiseNode> local_c8;
  Own<kj::WebSocket> wrapper;
  WebSocketPipe pipe;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> local_88;
  undefined1 local_78 [40];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  
  HttpHeaders::clone((HttpHeaders *)local_78,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_78);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_78);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_88.disposer = (Disposer *)&headers->indexedHeaders;
  local_88.ptr = (WebSocketResponseImpl *)headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
            ((Promise<void> *)&local_c8,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
             &(headers->unindexedHeaders).builder.pos);
  pWVar4 = (WebSocket *)operator_new(0x38);
  pWVar5 = pipe.ends[0].ptr;
  pPVar3 = local_c8.ptr;
  pipe.ends[0].ptr = (WebSocket *)0x0;
  local_78._0_8_ = pipe.ends[0].disposer;
  local_d8.disposer = local_c8.disposer;
  local_c8.ptr = (PromiseNode *)0x0;
  pWVar4->_vptr_WebSocket = (_func_int **)&PTR_send_0042c4f8;
  pWVar4[1]._vptr_WebSocket = (_func_int **)pipe.ends[0].disposer;
  pWVar4[2]._vptr_WebSocket = (_func_int **)pWVar5;
  local_78._8_8_ = (StringPtr *)0x0;
  *(undefined1 *)&pWVar4[3]._vptr_WebSocket = 1;
  pWVar4[4]._vptr_WebSocket = (_func_int **)local_c8.disposer;
  local_d8.ptr = (PromiseNode *)0x0;
  pWVar4[5]._vptr_WebSocket = (_func_int **)pPVar3;
  *(undefined2 *)&pWVar4[6]._vptr_WebSocket = 0;
  Own<kj::_::PromiseNode>::dispose(&local_d8);
  Own<kj::WebSocket>::dispose((Own<kj::WebSocket> *)local_78);
  wrapper.disposer =
       (Disposer *)
       &_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
        instance;
  wrapper.ptr = pWVar4;
  Own<kj::_::PromiseNode>::dispose(&local_c8);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>::~Own(&local_88);
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_78._0_4_ = 0x65;
  local_78._8_8_ = "Switching Protocols";
  local_78._16_8_ = 0x14;
  local_78._24_8_ = headersCopy.ptr;
  OVar6 = Own<kj::WebSocket>::attach<kj::Own<kj::HttpHeaders>>
                    ((Own<kj::WebSocket> *)&local_d8,(Own<kj::HttpHeaders> *)&wrapper);
  local_78._32_4_ = 2;
  local_50 = local_d8.disposer._0_4_;
  uStack_4c = local_d8.disposer._4_4_;
  uStack_48 = local_d8.ptr._0_4_;
  uStack_44 = local_d8.ptr._4_4_;
  local_d8.ptr = (PromiseNode *)0x0;
  (**(code **)(pHVar2->name).content.ptr)(pHVar2,local_78,OVar6.ptr);
  OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::~OneOf
            ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_78 + 0x20));
  Own<kj::WebSocket>::dispose((Own<kj::WebSocket> *)&local_d8);
  (this->super_Response)._vptr_Response = (_func_int **)pipe.ends[1].disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pipe.ends[1].ptr;
  pipe.ends[1].ptr = (WebSocket *)0x0;
  Own<kj::WebSocket>::dispose(&wrapper);
  WebSocketPipe::~WebSocketPipe(&pipe);
  pWVar5 = extraout_RDX;
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
    pWVar5 = extraout_RDX_00;
  }
  OVar6.ptr = pWVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }